

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O3

bool __thiscall gui::MenuBar::handleMouseMove(MenuBar *this,Vector2f *mouseParent)

{
  Vector2f VVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Transform *this_00;
  Vector2f *pVVar5;
  Vector2f mouseLocal;
  float local_28;
  float fStack_24;
  Vector2f local_18;
  
  bVar2 = Widget::handleMouseMove(&this->super_Widget,mouseParent);
  bVar3 = true;
  if (!bVar2) {
    iVar4 = (*(this->super_Widget).super_Drawable._vptr_Drawable[6])(this,mouseParent);
    if ((char)iVar4 != '\0') {
      this_00 = Widget::getInverseTransform(&this->super_Widget);
      VVar1 = sf::Transform::transformPoint(this_00,mouseParent);
      pVVar5 = Widget::getOrigin(&this->super_Widget);
      local_28 = VVar1.x;
      fStack_24 = VVar1.y;
      local_18.y = fStack_24 - (*pVVar5).y;
      local_18.x = local_28 - (*pVVar5).x;
      mouseUpdate(this,false,false,&local_18);
      bVar2 = Widget::isFocused(&this->super_Widget);
      return bVar2;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool MenuBar::handleMouseMove(const sf::Vector2f& mouseParent) {
    if (baseClass::handleMouseMove(mouseParent)) {
        return true;
    } else if (!isMouseIntersecting(mouseParent)) {
        return false;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);

    mouseUpdate(false, false, mouseLocal);
    return isFocused();
}